

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlSAXParseMemoryWithData
                    (xmlSAXHandlerPtr sax,char *buffer,int size,int recovery,void *data)

{
  xmlParserCtxtPtr ctxt_00;
  xmlParserInputPtr input_00;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr ret;
  void *data_local;
  int recovery_local;
  int size_local;
  char *buffer_local;
  xmlSAXHandlerPtr sax_local;
  
  ctxt = (xmlParserCtxtPtr)0x0;
  if (size < 0) {
    sax_local = (xmlSAXHandlerPtr)0x0;
  }
  else {
    ctxt_00 = xmlNewSAXParserCtxt(sax,(void *)0x0);
    if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
      sax_local = (xmlSAXHandlerPtr)0x0;
    }
    else {
      if (data != (void *)0x0) {
        ctxt_00->_private = data;
      }
      if (recovery != 0) {
        ctxt_00->options = ctxt_00->options | 1;
        ctxt_00->recovery = 1;
      }
      input_00 = xmlCtxtNewInputFromMemory(ctxt_00,(char *)0x0,buffer,(long)size,(char *)0x0,2);
      if (input_00 != (xmlParserInputPtr)0x0) {
        ctxt = (xmlParserCtxtPtr)xmlCtxtParseDocument(ctxt_00,input_00);
      }
      xmlFreeParserCtxt(ctxt_00);
      sax_local = (xmlSAXHandlerPtr)ctxt;
    }
  }
  return (xmlDocPtr)sax_local;
}

Assistant:

xmlDocPtr
xmlSAXParseMemoryWithData(xmlSAXHandlerPtr sax, const char *buffer,
                          int size, int recovery, void *data) {
    xmlDocPtr ret = NULL;
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;

    if (size < 0)
        return(NULL);

    ctxt = xmlNewSAXParserCtxt(sax, NULL);
    if (ctxt == NULL)
        return(NULL);

    if (data != NULL)
	ctxt->_private=data;

    if (recovery) {
        ctxt->options |= XML_PARSE_RECOVER;
        ctxt->recovery = 1;
    }

    input = xmlCtxtNewInputFromMemory(ctxt, NULL, buffer, size, NULL,
                                      XML_INPUT_BUF_STATIC);

    if (input != NULL)
        ret = xmlCtxtParseDocument(ctxt, input);

    xmlFreeParserCtxt(ctxt);
    return(ret);
}